

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *other;
  long lVar4;
  LogFinisher local_69;
  LogMessage local_68;
  
  do {
    iVar1 = this->stream_count_;
    if (iVar1 < 1) break;
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,(ulong)(uint)count);
    if ((char)iVar3 == '\0') {
      lVar4 = CONCAT44(extraout_var,iVar2) + (long)count;
      iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      if (lVar4 <= CONCAT44(extraout_var_00,iVar2)) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                   ,0x182);
        other = internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (final_byte_count) < (target_byte_count): ");
        internal::LogFinisher::operator=(&local_69,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
      this->bytes_retired_ = this->bytes_retired_ + CONCAT44(extraout_var_00,iVar2);
      count = (int)lVar4 - iVar2;
      this->streams_ = this->streams_ + 1;
      this->stream_count_ = this->stream_count_ + -1;
    }
  } while ((char)iVar3 == '\0');
  return 0 < iVar1;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64 target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64 final_byte_count = streams_[0]->ByteCount();
    GOOGLE_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}